

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_color nk_rgb_hex(char *rgb)

{
  int iVar1;
  int iVar2;
  char *in_RDI;
  char *c;
  nk_color col;
  char *local_18;
  nk_color local_4;
  
  local_18 = in_RDI;
  if (*in_RDI == '#') {
    local_18 = in_RDI + 1;
  }
  iVar1 = nk_parse_hex(local_18,2);
  iVar2 = nk_parse_hex(local_18 + 2,2);
  local_4.g = (char)iVar2;
  local_4.r = (char)iVar1;
  iVar1 = nk_parse_hex(local_18 + 4,2);
  local_4.b = (char)iVar1;
  local_4.a = 0xff;
  return local_4;
}

Assistant:

NK_API struct nk_color
nk_rgb_hex(const char *rgb)
{
struct nk_color col;
const char *c = rgb;
if (*c == '#') c++;
col.r = (nk_byte)nk_parse_hex(c, 2);
col.g = (nk_byte)nk_parse_hex(c+2, 2);
col.b = (nk_byte)nk_parse_hex(c+4, 2);
col.a = 255;
return col;
}